

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

void Fx_ManFindCommonPairs
               (Vec_Wec_t *vCubes,Vec_Int_t *vPart0,Vec_Int_t *vPart1,Vec_Int_t *vPairs,
               Vec_Int_t *vCompls,Vec_Int_t *vDiv,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  int *piVar15;
  ulong local_80;
  int *local_78;
  ulong local_60;
  
  piVar15 = vPart0->pArray;
  piVar7 = vPart1->pArray;
  iVar6 = vPart0->nSize;
  iVar3 = vPart1->nSize;
  vPairs->nSize = 0;
  vCompls->nSize = 0;
  if (0 < iVar3 && 0 < (long)iVar6) {
    piVar1 = piVar15 + iVar6;
    piVar2 = piVar7 + iVar3;
    do {
      lVar12 = (long)*piVar15;
      if ((lVar12 < 0) || (iVar6 = vCubes->nSize, iVar6 <= *piVar15)) {
LAB_0025bd90:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar5 = vCubes->pArray;
      if (pVVar5[lVar12].nSize < 1) {
LAB_0025bdaf:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar9 = (long)*piVar7;
      if ((lVar9 < 0) || (iVar6 <= *piVar7)) goto LAB_0025bd90;
      if (pVVar5[lVar9].nSize < 1) goto LAB_0025bdaf;
      iVar3 = *pVVar5[lVar12].pArray;
      if (iVar3 == *pVVar5[lVar9].pArray) {
        piVar13 = piVar15 + 1;
        uVar10 = 1;
        local_60 = 1;
        if (piVar13 < piVar1) {
          do {
            uVar8 = (uint)uVar10;
            lVar12 = (long)*piVar13;
            if ((lVar12 < 0) || (iVar6 <= *piVar13)) goto LAB_0025bd90;
            if (pVVar5[lVar12].nSize < 1) goto LAB_0025bdaf;
            if (iVar3 != *pVVar5[lVar12].pArray) break;
            uVar10 = uVar10 + 1;
            uVar8 = (uint)uVar10;
            piVar13 = piVar13 + 1;
          } while (piVar13 < piVar1);
          uVar10 = (ulong)uVar8;
        }
        local_78 = piVar7 + 1;
        if (local_78 < piVar2) {
          local_60 = 1;
          do {
            lVar12 = (long)*local_78;
            if ((lVar12 < 0) || (iVar6 <= *local_78)) goto LAB_0025bd90;
            if (pVVar5[lVar12].nSize < 1) goto LAB_0025bdaf;
            if (iVar3 != *pVVar5[lVar12].pArray) break;
            local_60 = local_60 + 1;
            local_78 = local_78 + 1;
          } while (local_78 < piVar2);
          local_60 = local_60 & 0xffffffff;
        }
        local_80 = 0;
        do {
          uVar14 = 0;
          do {
            uVar8 = piVar15[local_80];
            uVar4 = piVar7[uVar14];
            if (uVar8 != uVar4) {
              if (((((int)uVar8 < 0) || (vCubes->nSize <= (int)uVar8)) || ((int)uVar4 < 0)) ||
                 (vCubes->nSize <= (int)uVar4)) goto LAB_0025bd90;
              Fx_ManDivFindCubeFree
                        (vCubes->pArray + uVar8,vCubes->pArray + uVar4,vCubeFree,fWarning);
              uVar8 = 0;
              if (vCubeFree->nSize == 4) {
                iVar6 = Fx_ManDivNormalize(vCubeFree);
                uVar8 = (uint)(iVar6 == 1);
              }
              uVar4 = vDiv->nSize;
              if (uVar4 == vCubeFree->nSize) {
                if (0 < (int)uVar4) {
                  uVar11 = 0;
                  do {
                    if (vDiv->pArray[uVar11] != vCubeFree->pArray[uVar11]) goto LAB_0025bd39;
                    uVar11 = uVar11 + 1;
                  } while (uVar4 != uVar11);
                }
                Vec_IntPush(vPairs,piVar15[local_80]);
                Vec_IntPush(vPairs,piVar7[uVar14]);
                Vec_IntPush(vCompls,uVar8);
              }
            }
LAB_0025bd39:
            uVar14 = uVar14 + 1;
          } while (uVar14 != local_60);
          local_80 = local_80 + 1;
        } while (local_80 != uVar10);
      }
      else if (iVar3 < *pVVar5[lVar9].pArray) {
        local_78 = piVar7;
        piVar13 = piVar15 + 1;
      }
      else {
        local_78 = piVar7 + 1;
        piVar13 = piVar15;
      }
    } while ((piVar13 < piVar1) && (piVar7 = local_78, piVar15 = piVar13, local_78 < piVar2));
  }
  return;
}

Assistant:

void Fx_ManFindCommonPairs( Vec_Wec_t * vCubes, Vec_Int_t * vPart0, Vec_Int_t * vPart1, Vec_Int_t * vPairs, Vec_Int_t * vCompls, Vec_Int_t * vDiv, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vPart0->pArray;
    int * pBeg2 = vPart1->pArray;
    int * pEnd1 = vPart0->pArray + vPart0->nSize;
    int * pEnd2 = vPart1->pArray + vPart1->nSize;
    int i, k, i_, k_, fCompl, CubeId1, CubeId2;
    Vec_IntClear( vPairs );
    Vec_IntClear( vCompls );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        CubeId1 = Fx_ManGetCubeVar(vCubes, *pBeg1);
        CubeId2 = Fx_ManGetCubeVar(vCubes, *pBeg2);
        if ( CubeId1 == CubeId2 )
        {
            for ( i = 1; pBeg1+i < pEnd1; i++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg1[i]) )
                    break;
            for ( k = 1; pBeg2+k < pEnd2; k++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg2[k]) )
                    break;
            for ( i_ = 0; i_ < i; i_++ )
            for ( k_ = 0; k_ < k; k_++ )
            {
                if ( pBeg1[i_] == pBeg2[k_] )
                    continue;
                Fx_ManDivFindCubeFree( Vec_WecEntry(vCubes, pBeg1[i_]), Vec_WecEntry(vCubes, pBeg2[k_]), vCubeFree, fWarning );
                fCompl = (Vec_IntSize(vCubeFree) == 4 && Fx_ManDivNormalize(vCubeFree) == 1);
                if ( !Vec_IntEqual( vDiv, vCubeFree ) )
                    continue;
                Vec_IntPush( vPairs, pBeg1[i_] );
                Vec_IntPush( vPairs, pBeg2[k_] );
                Vec_IntPush( vCompls, fCompl );
            }
            pBeg1 += i;
            pBeg2 += k;
        }
        else if ( CubeId1 < CubeId2 )
            pBeg1++;
        else 
            pBeg2++;
    }
}